

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_input_begin(nk_context *ctx)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar4;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x367b,"void nk_input_begin(struct nk_context *)");
  }
  lVar2 = 0;
  do {
    *(undefined4 *)((long)(ctx->style).cursors + lVar2 + -0x68) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  (ctx->input).keyboard.text_len = 0;
  (ctx->input).mouse.scroll_delta.x = 0.0;
  (ctx->input).mouse.scroll_delta.y = 0.0;
  (ctx->input).mouse.prev = (ctx->input).mouse.pos;
  (ctx->input).mouse.delta.x = 0.0;
  auVar1 = _DAT_00151090;
  (ctx->input).mouse.delta.y = 0.0;
  lVar2 = 0;
  auVar3 = _DAT_001510d0;
  auVar5 = _DAT_001510b0;
  do {
    auVar6 = auVar5 ^ auVar1;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7fffffe2) {
      (ctx->input).keyboard.keys[lVar2].clicked = 0;
      (ctx->input).keyboard.keys[lVar2 + 1].clicked = 0;
    }
    auVar6 = auVar3 ^ auVar1;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7fffffe2) {
      (ctx->input).keyboard.keys[lVar2 + 2].clicked = 0;
      (ctx->input).keyboard.keys[lVar2 + 3].clicked = 0;
    }
    lVar2 = lVar2 + 4;
    lVar4 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 4;
    auVar5._8_8_ = lVar4 + 4;
    lVar4 = auVar3._8_8_;
    auVar3._0_8_ = auVar3._0_8_ + 4;
    auVar3._8_8_ = lVar4 + 4;
  } while (lVar2 != 0x20);
  return;
}

Assistant:

NK_API void
nk_input_begin(struct nk_context *ctx)
{
    int i;
    struct nk_input *in;
    NK_ASSERT(ctx);
    if (!ctx) return;
    in = &ctx->input;
    for (i = 0; i < NK_BUTTON_MAX; ++i)
        in->mouse.buttons[i].clicked = 0;

    in->keyboard.text_len = 0;
    in->mouse.scroll_delta = nk_vec2(0,0);
    in->mouse.prev.x = in->mouse.pos.x;
    in->mouse.prev.y = in->mouse.pos.y;
    in->mouse.delta.x = 0;
    in->mouse.delta.y = 0;
    for (i = 0; i < NK_KEY_MAX; i++)
        in->keyboard.keys[i].clicked = 0;
}